

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu_registers.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_546e0c::RegisterUint8_set_and_get_bit_Test::~RegisterUint8_set_and_get_bit_Test
          (RegisterUint8_set_and_get_bit_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RegisterUint8, set_and_get_bit) {
    Register<uint8_t> reg;
    reg.set_bit(0);
    EXPECT_TRUE(reg.is_set(0));
    EXPECT_EQ(0b0000'0001, reg.value());

    reg.set_bit(5);
    EXPECT_TRUE(reg.is_set(5));
    EXPECT_EQ(0b0010'0001, reg.value());
}